

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorRefinementAmenability.cpp
# Opt level: O0

Labeling * __thiscall
ColorRefinementAmenability::ColorRefinementAmenability::compute_stable_coloring
          (ColorRefinementAmenability *this,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *node_colors,
          unordered_multimap<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
          *colors_to_nodes,
          unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
          *node_to_color)

{
  initializer_list<std::pair<const_unsigned_long,_unsigned_int>_> __l;
  initializer_list<std::pair<const_unsigned_int,_unsigned_long>_> __l_00;
  bool bVar1;
  reference pvVar2;
  reference puVar3;
  size_type sVar4;
  unordered_multimap<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
  *in_RCX;
  Graph *in_RSI;
  Labeling *in_RDI;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_R8;
  Node i;
  uint num_nodes_1;
  Label *c;
  iterator __end3_1;
  iterator __begin3_1;
  Labels *__range3_1;
  Label new_color;
  Node *n;
  iterator __end3;
  iterator __begin3;
  Nodes *__range3;
  Nodes neighbors;
  Labels colors;
  Node v;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  new_colors;
  uint num_new_colors;
  uint num_old_colors;
  Labels new_coloring;
  Labels coloring;
  size_t num_nodes;
  Labeling *node_label;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_fffffffffffffde8;
  unordered_multimap<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
  *in_stack_fffffffffffffdf0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffdf8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffe00;
  value_type_conflict1 *in_stack_fffffffffffffe10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe20;
  pair<const_unsigned_int,_unsigned_long> local_1b0;
  pair<const_unsigned_int,_unsigned_long> *local_1a0;
  undefined8 local_198;
  pair<const_unsigned_long,_unsigned_int> local_190;
  pair<const_unsigned_long,_unsigned_int> *local_180;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_148;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_140;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_138;
  unsigned_long *local_130;
  unsigned_long *local_128;
  reference local_120;
  uint *local_118;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_110;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_108;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_100;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  uint local_cc;
  int local_90;
  int local_8c;
  undefined8 local_88;
  undefined8 local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  size_t local_38;
  byte local_29;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_28;
  unordered_multimap<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
  *local_20;
  
  local_29 = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  std::
  unordered_multimap<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
  ::unordered_multimap
            ((unordered_multimap<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
              *)0x108e06);
  local_38 = GraphLibrary::Graph::get_num_nodes(in_RSI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x108e36);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x108e43);
  local_80 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18,
             in_stack_fffffffffffffe10);
  local_88 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18,
             in_stack_fffffffffffffe10);
  local_8c = -1;
  local_90 = 1;
  while (local_90 != local_8c) {
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)0x108ecd);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88);
    local_8c = local_90;
    for (local_cc = 0; local_cc < local_38; local_cc = local_cc + 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x108f1f);
      GraphLibrary::Graph::get_neighbours
                ((Graph *)in_stack_fffffffffffffdf8._M_current,
                 (Node)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_100);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
      local_108 = &local_100;
      local_110._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              in_stack_fffffffffffffde8);
      local_118 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     in_stack_fffffffffffffde8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)in_stack_fffffffffffffdf0,
                                (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)in_stack_fffffffffffffde8), bVar1) {
        local_120 = __gnu_cxx::
                    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    ::operator*(&local_110);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                  (&local_60,(ulong)*local_120);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffe00._M_current,in_stack_fffffffffffffdf8._M_current);
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&local_110);
      }
      in_stack_fffffffffffffe20 = &local_e8;
      local_128 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffde8);
      local_130 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffde8);
      std::
      sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                (&local_60,(ulong)local_cc);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffffe00._M_current,in_stack_fffffffffffffdf8._M_current);
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffdf0);
      local_138 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)*pvVar2;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x10911f);
      local_140 = &local_e8;
      local_148._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_fffffffffffffde8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffde8)
      ;
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffdf0,
                                (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffde8), bVar1) {
        puVar3 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_148);
        in_stack_fffffffffffffe18 =
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             pairing((ColorRefinementAmenability *)in_RSI,(Label)local_138,*puVar3);
        local_138 = in_stack_fffffffffffffe18;
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_148);
      }
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::insert((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)in_stack_fffffffffffffe00._M_current,in_stack_fffffffffffffdf8._M_current);
      in_stack_fffffffffffffe00._M_current = (unsigned_long *)local_138;
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_78,(ulong)local_cc);
      *pvVar2 = (value_type)in_stack_fffffffffffffe00._M_current;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 in_stack_fffffffffffffe00._M_current);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffffe00._M_current);
    }
    sVar4 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::size((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)0x10927b);
    local_90 = (int)sVar4;
    if (local_90 == local_8c) {
      in_stack_fffffffffffffdf8._M_current =
           (unsigned_long *)GraphLibrary::Graph::get_num_nodes(in_RSI);
      in_stack_fffffffffffffe94 = (uint)in_stack_fffffffffffffdf8._M_current;
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operator=((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      for (in_stack_fffffffffffffe90 = 0; in_stack_fffffffffffffe90 < in_stack_fffffffffffffe94;
          in_stack_fffffffffffffe90 = in_stack_fffffffffffffe90 + 1) {
        in_stack_fffffffffffffdf0 = local_20;
        pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_78,(ulong)in_stack_fffffffffffffe90);
        std::pair<const_unsigned_long,_unsigned_int>::pair<unsigned_long_&,_unsigned_int_&,_true>
                  (&local_190,pvVar2,(uint *)&stack0xfffffffffffffe90);
        local_180 = &local_190;
        in_stack_fffffffffffffe88 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1;
        __l._M_len = (size_type)in_stack_fffffffffffffe00._M_current;
        __l._M_array = (iterator)in_stack_fffffffffffffdf8._M_current;
        std::
        unordered_multimap<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
        ::insert(in_stack_fffffffffffffdf0,__l);
        in_stack_fffffffffffffde8 = local_28;
        pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&local_78,(ulong)in_stack_fffffffffffffe90);
        std::pair<const_unsigned_int,_unsigned_long>::pair<unsigned_int_&,_unsigned_long_&,_true>
                  (&local_1b0,(uint *)&stack0xfffffffffffffe90,pvVar2);
        local_1a0 = &local_1b0;
        local_198 = 1;
        __l_00._M_len = (size_type)in_stack_fffffffffffffe00._M_current;
        __l_00._M_array = (iterator)in_stack_fffffffffffffdf8._M_current;
        std::
        unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
        ::insert((unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                  *)in_stack_fffffffffffffdf0,__l_00);
      }
    }
    std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)0x1093ec);
  }
  local_29 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffe00._M_current);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffe00._M_current);
  if ((local_29 & 1) == 0) {
    std::
    unordered_multimap<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
    ::~unordered_multimap
              ((unordered_multimap<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
                *)0x109454);
  }
  return in_RDI;
}

Assistant:

Labeling ColorRefinementAmenability::compute_stable_coloring(unordered_set<Label> &node_colors,
                                                                 unordered_multimap<Label, Node> &colors_to_nodes,
                                                                 unordered_map<Node, Label> &node_to_color) const {
        Labeling node_label;
        size_t num_nodes = m_graph.get_num_nodes();

        Labels coloring;
        Labels new_coloring;

        // Labels each node with the same label.
        coloring.resize(num_nodes, 0);
        new_coloring.resize(num_nodes, 1);
        uint num_old_colors = -1;
        uint num_new_colors = 1;

        while (num_new_colors != num_old_colors) {
            unordered_set<Label> new_colors;

            // Update coloring.
            coloring = new_coloring;
            num_old_colors = num_new_colors;

            // Iterate over all nodes.
            for (Node v = 0; v < num_nodes; ++v) {
                Labels colors;
                Nodes neighbors(m_graph.get_neighbours(v));
                colors.reserve(neighbors.size() + 1);

                // Get colors of neighbors.
                for (const Node &n: neighbors) {
                    colors.push_back(coloring[n]);
                }
                sort(colors.begin(), colors.end());
                colors.push_back(coloring[v]);

                // Compute new label using composition to bijectively map two integers to on integer.ŧ
                Label new_color = colors.back();
                colors.pop_back();
                for (const Label &c: colors) {
                    new_color = pairing(new_color, c);
                }

                new_colors.insert(new_color);
                new_coloring[v] = new_color;

            }

            num_new_colors = new_colors.size();
            if (num_new_colors == num_old_colors) {
                uint num_nodes = m_graph.get_num_nodes();

                node_colors = new_colors;

                for (Node i = 0; i < num_nodes; ++i) {
                    colors_to_nodes.insert({{new_coloring[i], i}});
                    node_to_color.insert({{i, new_coloring[i]}});
                }
            }

        }

        return node_label;
    }